

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slice_plane.cpp
# Opt level: O2

void polyscope::buildSlicePlaneGUI(void)

{
  undefined8 *puVar1;
  bool bVar2;
  unique_ptr<polyscope::SlicePlane,_std::default_delete<polyscope::SlicePlane>_> *s;
  undefined8 *puVar3;
  ImVec2 local_18;
  
  ImGui::SetNextItemOpen(false,4);
  if (openSlicePlaneMenu == '\x01') {
    ImGui::SetNextItemOpen(true,0);
    openSlicePlaneMenu = '\0';
  }
  bVar2 = ImGui::TreeNode("Slice Planes");
  if (bVar2) {
    local_18.x = 0.0;
    local_18.y = 0.0;
    bVar2 = ImGui::Button("Add plane",&local_18);
    if (bVar2) {
      addSceneSlicePlane(true);
    }
    ImGui::SameLine(0.0,-1.0);
    local_18.x = 0.0;
    local_18.y = 0.0;
    bVar2 = ImGui::Button("Remove plane",&local_18);
    puVar3 = state::slicePlanes;
    puVar1 = DAT_0059cd80;
    if (bVar2) {
      removeLastSceneSlicePlane();
      puVar3 = state::slicePlanes;
      puVar1 = DAT_0059cd80;
    }
    for (; puVar3 != puVar1; puVar3 = puVar3 + 1) {
      SlicePlane::buildGUI((SlicePlane *)*puVar3);
    }
    ImGui::TreePop();
  }
  return;
}

Assistant:

void buildSlicePlaneGUI() {


  ImGui::SetNextTreeNodeOpen(false, ImGuiCond_FirstUseEver);
  if (openSlicePlaneMenu) {
    ImGui::SetNextTreeNodeOpen(true);
    openSlicePlaneMenu = false;
  }
  if (ImGui::TreeNode("Slice Planes")) {
    if (ImGui::Button("Add plane")) {
      addSceneSlicePlane(true);
    }
    ImGui::SameLine();
    if (ImGui::Button("Remove plane")) {
      removeLastSceneSlicePlane();
    }
    for (std::unique_ptr<SlicePlane>& s : state::slicePlanes) {
      s->buildGUI();
    }
    ImGui::TreePop();
  }
}